

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

void tcg_opt_gen_mov(TCGContext_conflict9 *s,TCGOp *op,TCGArg dst,TCGArg src)

{
  byte bVar1;
  undefined1 *puVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  _Bool _Var6;
  undefined1 uVar7;
  undefined1 uVar8;
  ulong uVar9;
  
  _Var6 = ts_are_copies((TCGTemp *)dst,(TCGTemp *)src);
  if (_Var6) {
    tcg_op_remove_tricore(s,op);
    return;
  }
  puVar2 = *(undefined1 **)(dst + 0x30);
  lVar3 = *(long *)(puVar2 + 0x10);
  lVar4 = *(long *)(*(long *)(puVar2 + 8) + 0x30);
  *(long *)(*(long *)(lVar3 + 0x30) + 8) = *(long *)(puVar2 + 8);
  *(long *)(lVar4 + 0x10) = lVar3;
  *(TCGArg *)(puVar2 + 0x10) = dst;
  *(TCGArg *)(puVar2 + 8) = dst;
  *puVar2 = 0;
  *(undefined8 *)(puVar2 + 0x20) = 0xffffffffffffffff;
  puVar5 = *(undefined1 **)(src + 0x30);
  bVar1 = s->tcg_op_defs[*(byte *)op].flags;
  uVar8 = 0x3f;
  if ((bVar1 & 0x10) == 0) {
    uVar8 = 5;
  }
  uVar7 = 0x89;
  if ((bVar1 & 0x40) == 0) {
    uVar7 = uVar8;
  }
  *(undefined1 *)op = uVar7;
  op->args[0] = dst;
  op->args[1] = src;
  uVar9 = *(ulong *)(puVar5 + 0x20) | 0xffffffff00000000;
  if ((bVar1 & 0x50) != 0) {
    uVar9 = *(ulong *)(puVar5 + 0x20);
  }
  *(ulong *)(puVar2 + 0x20) = uVar9;
  if (((*(uint *)dst ^ *(uint *)src) & 0xff000000) == 0) {
    lVar3 = *(long *)(*(long *)(puVar5 + 0x10) + 0x30);
    *(long *)(puVar2 + 0x10) = *(long *)(puVar5 + 0x10);
    *(TCGArg *)(puVar2 + 8) = src;
    *(TCGArg *)(lVar3 + 8) = dst;
    *(TCGArg *)(puVar5 + 0x10) = dst;
    *puVar2 = *puVar5;
    *(undefined8 *)(puVar2 + 0x18) = *(undefined8 *)(puVar5 + 0x18);
  }
  return;
}

Assistant:

static void tcg_opt_gen_mov(TCGContext *s, TCGOp *op, TCGArg dst, TCGArg src)
{
    TCGTemp *dst_ts = arg_temp(dst);
    TCGTemp *src_ts = arg_temp(src);
    const TCGOpDef *def;
    struct tcg_temp_info *di;
    struct tcg_temp_info *si;
    tcg_target_ulong mask;
    TCGOpcode new_op;

    if (ts_are_copies(dst_ts, src_ts)) {
        tcg_op_remove(s, op);
        return;
    }

    reset_ts(dst_ts);
    di = ts_info(dst_ts);
    si = ts_info(src_ts);
    def = &s->tcg_op_defs[op->opc];
    if (def->flags & TCG_OPF_VECTOR) {
        new_op = INDEX_op_mov_vec;
    } else if (def->flags & TCG_OPF_64BIT) {
        new_op = INDEX_op_mov_i64;
    } else {
        new_op = INDEX_op_mov_i32;
    }
    op->opc = new_op;
    /* TCGOP_VECL and TCGOP_VECE remain unchanged.  */
    op->args[0] = dst;
    op->args[1] = src;

    mask = si->mask;
    if (TCG_TARGET_REG_BITS > 32 && new_op == INDEX_op_mov_i32) {
        /* High bits of the destination are now garbage.  */
        mask |= ~0xffffffffull;
    }
    di->mask = mask;

    if (src_ts->type == dst_ts->type) {
        struct tcg_temp_info *ni = ts_info(si->next_copy);

        di->next_copy = si->next_copy;
        di->prev_copy = src_ts;
        ni->prev_copy = dst_ts;
        si->next_copy = dst_ts;
        di->is_const = si->is_const;
        di->val = si->val;
    }
}